

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O0

tiles_t * read_tiles(tiles_t *__return_storage_ptr__,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *tokens)

{
  char *this;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  pointer pbVar2;
  mapped_type *this_00;
  pointer this_01;
  size_type sVar3;
  size_type sVar4;
  reference __r;
  reference this_02;
  iterator __result;
  invalid_argument *this_03;
  size_type sVar5;
  pair<std::array<char,_10UL>,_std::array<char,_10UL>_> *local_4d0;
  undefined1 *local_4b8;
  undefined1 *local_4a0;
  pair<std::array<char,_10UL>,_std::array<char,_10UL>_> *local_480;
  char *local_468;
  tile_t *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  size_t local_400;
  char *local_3f8;
  undefined1 local_3f0 [352];
  corners_t local_290;
  edges_t local_1f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  int local_198;
  int row;
  undefined1 local_188 [8];
  tile_t tile;
  const_iterator it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_local;
  tiles_t *tiles;
  
  memset(__return_storage_ptr__,0,0x38);
  std::
  unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  tile._344_8_ = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::cbegin(tokens);
  local_188 = (undefined1  [8])0x0;
  local_440 = &tile;
  memset(local_440,0,100);
  do {
    local_440 = (tile_t *)((local_440->data)._M_elems[0]._M_elems + 2);
  } while (local_440 != (tile_t *)(tile.data._M_elems[9]._M_elems + 2));
  local_468 = tile.data._M_elems[9]._M_elems + 2;
  memset(local_468,0,0x50);
  do {
    local_468 = local_468 + 10;
  } while (local_468 != tile.edges._M_elems[7]._M_elems + 2);
  local_480 = (pair<std::array<char,_10UL>,_std::array<char,_10UL>_> *)
              (tile.edges._M_elems[7]._M_elems + 2);
  do {
    std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>::
    pair<std::array<char,_10UL>,_std::array<char,_10UL>,_true>(local_480);
    local_480 = local_480 + 1;
  } while (local_480 !=
           (pair<std::array<char,_10UL>,_std::array<char,_10UL>_> *)
           (tile.corners._M_elems[7].second._M_elems + 2));
  local_198 = 0;
  while( true ) {
    local_1a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::cend(tokens);
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(tile.corners._M_elems[7].second._M_elems + 6),&local_1a0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(tile.corners._M_elems[7].second._M_elems + 6));
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (pbVar2);
    if (bVar1) {
      if (local_198 == 10) {
        generic_tile_t<10UL>::make_edges(&local_1f0,(generic_tile_t<10UL> *)local_188);
        tile.edges._M_elems[5]._M_elems[6] = local_1f0._M_elems[6]._M_elems[4];
        tile.edges._M_elems[5]._M_elems[7] = local_1f0._M_elems[6]._M_elems[5];
        tile.edges._M_elems[5]._M_elems[8] = local_1f0._M_elems[6]._M_elems[6];
        tile.edges._M_elems[5]._M_elems[9] = local_1f0._M_elems[6]._M_elems[7];
        tile.edges._M_elems[6]._M_elems[0] = local_1f0._M_elems[6]._M_elems[8];
        tile.edges._M_elems[6]._M_elems[1] = local_1f0._M_elems[6]._M_elems[9];
        tile.edges._M_elems[6]._M_elems[2] = local_1f0._M_elems[7]._M_elems[0];
        tile.edges._M_elems[6]._M_elems[3] = local_1f0._M_elems[7]._M_elems[1];
        tile.edges._M_elems[6]._M_elems[4] = local_1f0._M_elems[7]._M_elems[2];
        tile.edges._M_elems[6]._M_elems[5] = local_1f0._M_elems[7]._M_elems[3];
        tile.edges._M_elems[6]._M_elems[6] = local_1f0._M_elems[7]._M_elems[4];
        tile.edges._M_elems[6]._M_elems[7] = local_1f0._M_elems[7]._M_elems[5];
        tile.edges._M_elems[6]._M_elems[8] = local_1f0._M_elems[7]._M_elems[6];
        tile.edges._M_elems[6]._M_elems[9] = local_1f0._M_elems[7]._M_elems[7];
        tile.edges._M_elems[7]._M_elems[0] = local_1f0._M_elems[7]._M_elems[8];
        tile.edges._M_elems[7]._M_elems[1] = local_1f0._M_elems[7]._M_elems[9];
        tile.edges._M_elems[4]._M_elems[0] = local_1f0._M_elems[4]._M_elems[8];
        tile.edges._M_elems[4]._M_elems[1] = local_1f0._M_elems[4]._M_elems[9];
        tile.edges._M_elems[4]._M_elems[2] = local_1f0._M_elems[5]._M_elems[0];
        tile.edges._M_elems[4]._M_elems[3] = local_1f0._M_elems[5]._M_elems[1];
        tile.edges._M_elems[4]._M_elems[4] = local_1f0._M_elems[5]._M_elems[2];
        tile.edges._M_elems[4]._M_elems[5] = local_1f0._M_elems[5]._M_elems[3];
        tile.edges._M_elems[4]._M_elems[6] = local_1f0._M_elems[5]._M_elems[4];
        tile.edges._M_elems[4]._M_elems[7] = local_1f0._M_elems[5]._M_elems[5];
        tile.edges._M_elems[4]._M_elems[8] = local_1f0._M_elems[5]._M_elems[6];
        tile.edges._M_elems[4]._M_elems[9] = local_1f0._M_elems[5]._M_elems[7];
        tile.edges._M_elems[5]._M_elems[0] = local_1f0._M_elems[5]._M_elems[8];
        tile.edges._M_elems[5]._M_elems[1] = local_1f0._M_elems[5]._M_elems[9];
        tile.edges._M_elems[5]._M_elems[2] = local_1f0._M_elems[6]._M_elems[0];
        tile.edges._M_elems[5]._M_elems[3] = local_1f0._M_elems[6]._M_elems[1];
        tile.edges._M_elems[5]._M_elems[4] = local_1f0._M_elems[6]._M_elems[2];
        tile.edges._M_elems[5]._M_elems[5] = local_1f0._M_elems[6]._M_elems[3];
        tile.edges._M_elems[2]._M_elems[4] = local_1f0._M_elems[3]._M_elems[2];
        tile.edges._M_elems[2]._M_elems[5] = local_1f0._M_elems[3]._M_elems[3];
        tile.edges._M_elems[2]._M_elems[6] = local_1f0._M_elems[3]._M_elems[4];
        tile.edges._M_elems[2]._M_elems[7] = local_1f0._M_elems[3]._M_elems[5];
        tile.edges._M_elems[2]._M_elems[8] = local_1f0._M_elems[3]._M_elems[6];
        tile.edges._M_elems[2]._M_elems[9] = local_1f0._M_elems[3]._M_elems[7];
        tile.edges._M_elems[3]._M_elems[0] = local_1f0._M_elems[3]._M_elems[8];
        tile.edges._M_elems[3]._M_elems[1] = local_1f0._M_elems[3]._M_elems[9];
        tile.edges._M_elems[3]._M_elems[2] = local_1f0._M_elems[4]._M_elems[0];
        tile.edges._M_elems[3]._M_elems[3] = local_1f0._M_elems[4]._M_elems[1];
        tile.edges._M_elems[3]._M_elems[4] = local_1f0._M_elems[4]._M_elems[2];
        tile.edges._M_elems[3]._M_elems[5] = local_1f0._M_elems[4]._M_elems[3];
        tile.edges._M_elems[3]._M_elems[6] = local_1f0._M_elems[4]._M_elems[4];
        tile.edges._M_elems[3]._M_elems[7] = local_1f0._M_elems[4]._M_elems[5];
        tile.edges._M_elems[3]._M_elems[8] = local_1f0._M_elems[4]._M_elems[6];
        tile.edges._M_elems[3]._M_elems[9] = local_1f0._M_elems[4]._M_elems[7];
        tile.edges._M_elems[0]._M_elems[8] = local_1f0._M_elems[1]._M_elems[6];
        tile.edges._M_elems[0]._M_elems[9] = local_1f0._M_elems[1]._M_elems[7];
        tile.edges._M_elems[1]._M_elems[0] = local_1f0._M_elems[1]._M_elems[8];
        tile.edges._M_elems[1]._M_elems[1] = local_1f0._M_elems[1]._M_elems[9];
        tile.edges._M_elems[1]._M_elems[2] = local_1f0._M_elems[2]._M_elems[0];
        tile.edges._M_elems[1]._M_elems[3] = local_1f0._M_elems[2]._M_elems[1];
        tile.edges._M_elems[1]._M_elems[4] = local_1f0._M_elems[2]._M_elems[2];
        tile.edges._M_elems[1]._M_elems[5] = local_1f0._M_elems[2]._M_elems[3];
        tile.edges._M_elems[1]._M_elems[6] = local_1f0._M_elems[2]._M_elems[4];
        tile.edges._M_elems[1]._M_elems[7] = local_1f0._M_elems[2]._M_elems[5];
        tile.edges._M_elems[1]._M_elems[8] = local_1f0._M_elems[2]._M_elems[6];
        tile.edges._M_elems[1]._M_elems[9] = local_1f0._M_elems[2]._M_elems[7];
        tile.edges._M_elems[2]._M_elems[0] = local_1f0._M_elems[2]._M_elems[8];
        tile.edges._M_elems[2]._M_elems[1] = local_1f0._M_elems[2]._M_elems[9];
        tile.edges._M_elems[2]._M_elems[2] = local_1f0._M_elems[3]._M_elems[0];
        tile.edges._M_elems[2]._M_elems[3] = local_1f0._M_elems[3]._M_elems[1];
        tile.data._M_elems[9]._M_elems[2] = local_1f0._M_elems[0]._M_elems[0];
        tile.data._M_elems[9]._M_elems[3] = local_1f0._M_elems[0]._M_elems[1];
        tile.data._M_elems[9]._M_elems[4] = local_1f0._M_elems[0]._M_elems[2];
        tile.data._M_elems[9]._M_elems[5] = local_1f0._M_elems[0]._M_elems[3];
        tile.data._M_elems[9]._M_elems[6] = local_1f0._M_elems[0]._M_elems[4];
        tile.data._M_elems[9]._M_elems[7] = local_1f0._M_elems[0]._M_elems[5];
        tile.data._M_elems[9]._M_elems[8] = local_1f0._M_elems[0]._M_elems[6];
        tile.data._M_elems[9]._M_elems[9] = local_1f0._M_elems[0]._M_elems[7];
        tile.edges._M_elems[0]._M_elems[0] = local_1f0._M_elems[0]._M_elems[8];
        tile.edges._M_elems[0]._M_elems[1] = local_1f0._M_elems[0]._M_elems[9];
        tile.edges._M_elems[0]._M_elems[2] = local_1f0._M_elems[1]._M_elems[0];
        tile.edges._M_elems[0]._M_elems[3] = local_1f0._M_elems[1]._M_elems[1];
        tile.edges._M_elems[0]._M_elems[4] = local_1f0._M_elems[1]._M_elems[2];
        tile.edges._M_elems[0]._M_elems[5] = local_1f0._M_elems[1]._M_elems[3];
        tile.edges._M_elems[0]._M_elems[6] = local_1f0._M_elems[1]._M_elems[4];
        tile.edges._M_elems[0]._M_elems[7] = local_1f0._M_elems[1]._M_elems[5];
        generic_tile_t<10UL>::make_corners(&local_290,(generic_tile_t<10UL> *)local_188);
        std::array<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_8UL>::operator=
                  ((array<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_8UL> *)
                   (tile.edges._M_elems[7]._M_elems + 2),&local_290);
        this_00 = std::
                  unordered_map<unsigned_long,_generic_tile_t<10UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>_>
                  ::operator[](__return_storage_ptr__,(key_type *)local_188);
        generic_tile_t<10UL>::operator=(this_00,(generic_tile_t<10UL> *)local_188);
      }
      local_198 = 0;
      local_3f0._0_8_ = 0;
      local_4a0 = local_3f0 + 8;
      memset(local_4a0,0,100);
      do {
        local_4a0 = local_4a0 + 10;
      } while (local_4a0 != local_3f0 + 0x6c);
      local_4b8 = local_3f0 + 0x6c;
      memset(local_4b8,0,0x50);
      do {
        local_4b8 = local_4b8 + 10;
      } while (local_4b8 != local_3f0 + 0xbc);
      local_4d0 = (pair<std::array<char,_10UL>,_std::array<char,_10UL>_> *)(local_3f0 + 0xbc);
      do {
        std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>::
        pair<std::array<char,_10UL>,_std::array<char,_10UL>,_true>(local_4d0);
        local_4d0 = local_4d0 + 1;
      } while (local_4d0 !=
               (pair<std::array<char,_10UL>,_std::array<char,_10UL>_> *)(local_3f0 + 0x15c));
      generic_tile_t<10UL>::operator=
                ((generic_tile_t<10UL> *)local_188,(generic_tile_t<10UL> *)local_3f0);
    }
    else {
      pbVar2 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)(tile.corners._M_elems[7].second._M_elems + 6));
      local_400 = 5;
      local_3f8 = "Tile ";
      __x._M_str = "Tile ";
      __x._M_len = 5;
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              starts_with(pbVar2,__x);
      if (bVar1) {
        this = tile.corners._M_elems[7].second._M_elems + 6;
        pbVar2 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&read_tiles::id_prefix);
        this_01 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)this);
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(this_01);
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&read_tiles::id_prefix);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_420,pbVar2,sVar5,~sVar4 + sVar3);
        local_188 = (undefined1  [8])std::__cxx11::stoull(&local_420,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_420);
      }
      else {
        __r = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(tile.corners._M_elems[7].second._M_elems + 6));
        sVar5 = (size_type)local_198;
        local_198 = local_198 + 1;
        this_02 = std::array<std::array<char,_10UL>,_10UL>::operator[]
                            ((array<std::array<char,_10UL>,_10UL> *)&tile,sVar5);
        __result = std::array<char,_10UL>::begin(this_02);
        std::ranges::__copy_fn::
        operator()<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*>
                  ((__copy_fn *)&std::ranges::copy,__r,__result);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(tile.corners._M_elems[7].second._M_elems + 6),0);
  }
  if (local_198 != 0) {
    this_03 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_03,"Unprocessed data, did you end with an empty line?");
    __cxa_throw(this_03,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return __return_storage_ptr__;
}

Assistant:

tiles_t read_tiles(const std::vector<std::string>& tokens) {
  auto tiles = tiles_t {};

  auto it = tokens.cbegin();
  auto tile = tile_t {};
  static constexpr auto id_prefix = std::string_view {"Tile "};
  auto row = 0;
  while (it != tokens.cend()) {
    if (it->empty()) { // make sure to end with an empty line
      if (row == 10) {
        tile.edges = tile.make_edges();
        tile.corners = tile.make_corners();
        tiles[tile.id] = tile;
      }
      row = 0;
      tile = {};
    } else if (it->starts_with(id_prefix)) {
      tile.id = std::stoull(it->substr(id_prefix.size(), it->size() - id_prefix.size()-1));
    } else {
      ranges::copy(*it, tile.data[row++].begin());
    }

    it++;
  }
  if (row != 0) {
    throw std::invalid_argument("Unprocessed data, did you end with an empty line?");
  }

  return tiles;
}